

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O3

bool embree::avx::
     stitch_row<embree::avx::PatchEvalGrid,embree::PatchT<embree::Vec3fa,embree::Vec3fa>::Ref>
               (Ref *patch,int subPatch,bool bottom,uint x0,uint x1,int fine_x,int coarse_x,
               float *Px,float *Py,float *Pz,float *U,float *V,float *Nx,float *Ny,float *Nz,
               uint dy0,uint dwidth,uint dheight)

{
  size_t size;
  int iVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  int iVar4;
  uint uVar5;
  undefined1 *puVar6;
  ulong uVar7;
  int iVar8;
  StackArray<float,_128UL> ny;
  StackArray<float,_128UL> nx;
  StackArray<float,_128UL> v;
  StackArray<float,_128UL> u;
  StackArray<float,_128UL> pz;
  StackArray<float,_128UL> py;
  StackArray<float,_128UL> px;
  StackArray<float,_128UL> nz;
  undefined1 local_700 [128];
  undefined1 *local_680;
  ulong local_678;
  undefined1 local_640 [128];
  undefined1 *local_5c0;
  ulong local_5b8;
  undefined1 local_580 [128];
  undefined1 *local_500;
  ulong local_4f8;
  undefined1 local_4c0 [128];
  undefined1 *local_440;
  ulong local_438;
  undefined1 local_400 [128];
  undefined1 *local_380;
  ulong local_378;
  undefined1 local_340 [128];
  undefined1 *local_2c0;
  ulong local_2b8;
  undefined1 local_280 [128];
  undefined1 *local_200;
  ulong local_1f8;
  undefined1 local_1c0 [128];
  undefined1 *local_140;
  ulong local_138;
  PatchEvalGrid local_e8;
  
  if (fine_x != coarse_x) {
    iVar4 = (x0 * 2 + 1) * coarse_x;
    iVar1 = fine_x * 2;
    iVar8 = iVar4 / iVar1;
    uVar7 = (long)(int)((x1 * 2 + 1) * coarse_x) / (long)iVar1;
    uVar5 = ((int)uVar7 - iVar8) + 9;
    local_678 = (ulong)uVar5;
    local_5b8 = local_678;
    local_4f8 = local_678;
    local_438 = local_678;
    local_378 = local_678;
    local_2b8 = local_678;
    local_1f8 = local_678;
    local_138 = local_678;
    if (uVar5 < 0x21) {
      local_200 = local_280;
      local_2c0 = local_340;
      local_380 = local_400;
      local_440 = local_4c0;
      local_500 = local_580;
      local_5c0 = local_640;
      local_680 = local_700;
      local_140 = local_1c0;
    }
    else {
      size = local_678 * 4;
      local_200 = (undefined1 *)alignedMalloc(size,0x40);
      local_2c0 = (undefined1 *)alignedMalloc(size,0x40);
      local_380 = (undefined1 *)alignedMalloc(size,0x40);
      local_440 = (undefined1 *)alignedMalloc(size,0x40);
      local_500 = (undefined1 *)alignedMalloc(size,0x40);
      local_5c0 = (undefined1 *)alignedMalloc(size,0x40);
      local_680 = (undefined1 *)alignedMalloc(size,0x40);
      local_140 = (undefined1 *)alignedMalloc(size,0x40);
    }
    puVar6 = local_140;
    puVar2 = local_680;
    puVar3 = local_5c0;
    if (Nx == (float *)0x0) {
      puVar6 = (undefined1 *)0x0;
      puVar2 = (undefined1 *)0x0;
      puVar3 = (undefined1 *)0x0;
    }
    PatchEvalGrid::PatchEvalGrid
              (&local_e8,*(undefined8 *)patch,subPatch,iVar8,uVar7 & 0xffffffff,bottom,bottom,
               coarse_x + 1,2,local_200,local_2c0,local_380,local_440,local_500,puVar3,puVar2,puVar6
               ,0x1001,1);
    if (x0 <= x1) {
      uVar5 = dy0 * dwidth;
      do {
        uVar7 = (ulong)(uint)(iVar4 / iVar1 - iVar8);
        Px[uVar5] = *(float *)(local_200 + uVar7 * 4);
        Py[uVar5] = *(float *)(local_2c0 + uVar7 * 4);
        Pz[uVar5] = *(float *)(local_380 + uVar7 * 4);
        U[uVar5] = *(float *)(local_440 + uVar7 * 4);
        V[uVar5] = *(float *)(local_500 + uVar7 * 4);
        if (Nx != (float *)0x0) {
          Nx[uVar5] = *(float *)(local_5c0 + uVar7 * 4);
          Ny[uVar5] = *(float *)(local_680 + uVar7 * 4);
          Nz[uVar5] = *(float *)(local_140 + uVar7 * 4);
        }
        x0 = x0 + 1;
        iVar4 = iVar4 + coarse_x * 2;
        uVar5 = uVar5 + 1;
      } while (x0 <= x1);
    }
    if (local_140 != local_1c0) {
      alignedFree(local_140);
    }
    if (local_680 != local_700) {
      alignedFree(local_680);
    }
    if (local_5c0 != local_640) {
      alignedFree(local_5c0);
    }
    if (local_500 != local_580) {
      alignedFree(local_500);
    }
    if (local_440 != local_4c0) {
      alignedFree(local_440);
    }
    if (local_380 != local_400) {
      alignedFree(local_380);
    }
    if (local_2c0 != local_340) {
      alignedFree(local_2c0);
    }
    if (local_200 != local_280) {
      alignedFree(local_200);
    }
  }
  return fine_x != coarse_x;
}

Assistant:

bool stitch_row(const Patch& patch, int subPatch, 
                      const bool bottom, const unsigned x0, const unsigned x1, const int fine_x, const int coarse_x, 
                      float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dy0, const unsigned dwidth, const unsigned dheight)
    {
      assert(coarse_x <= fine_x);
      if (likely(fine_x == coarse_x))
	return false;
      
      const unsigned x0s = stitch(x0,fine_x,coarse_x);
      const unsigned x1s = stitch(x1,fine_x,coarse_x);
      const unsigned M = x1s-x0s+1 + VSIZEX;

      dynamic_large_stack_array(float,px,M,32*sizeof(float));
      dynamic_large_stack_array(float,py,M,32*sizeof(float));
      dynamic_large_stack_array(float,pz,M,32*sizeof(float));
      dynamic_large_stack_array(float,u,M,32*sizeof(float));
      dynamic_large_stack_array(float,v,M,32*sizeof(float));
      dynamic_large_stack_array(float,nx,M,32*sizeof(float));
      dynamic_large_stack_array(float,ny,M,32*sizeof(float));
      dynamic_large_stack_array(float,nz,M,32*sizeof(float));
      const bool has_Nxyz = Nx; assert(!Nx || (Ny && Nz));
      Eval(patch,subPatch, x0s,x1s, bottom,bottom, coarse_x+1,2, px,py,pz,u,v, 
           has_Nxyz ? (float*)nx :nullptr, has_Nxyz ? (float*)ny : nullptr , has_Nxyz ? (float*)nz : nullptr, 4097,1);
      
      for (unsigned x=x0; x<=x1; x++) 
      {
	const unsigned xs = stitch(x,fine_x,coarse_x)-x0s;
	Px[dy0*dwidth+x-x0] = px[xs];
        Py[dy0*dwidth+x-x0] = py[xs];
        Pz[dy0*dwidth+x-x0] = pz[xs];
        U [dy0*dwidth+x-x0] = u[xs];
        V [dy0*dwidth+x-x0] = v[xs];
        if (unlikely(has_Nxyz)) {
          Nx[dy0*dwidth+x-x0] = nx[xs];
          Ny[dy0*dwidth+x-x0] = ny[xs];
          Nz[dy0*dwidth+x-x0] = nz[xs];
        }
      }
      return true;
    }